

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

cmCPackComponentGroup * __thiscall
cmCPackIFWGenerator::GetComponentGroup
          (cmCPackIFWGenerator *this,string *projectName,string *groupName)

{
  PackagesMap *this_00;
  cmCPackLog *this_01;
  long *msg;
  int iVar1;
  cmCPackComponentGroup *group;
  iterator iVar2;
  mapped_type *this_02;
  ostream *poVar3;
  size_t length;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
  pVar4;
  string name;
  cmCPackIFWPackage *package;
  ostringstream cmCPackLog_msg;
  string local_1e0;
  mapped_type *local_1c0;
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  mapped_type *local_178;
  ios_base local_128 [264];
  
  group = cmCPackGenerator::GetComponentGroup(&this->super_cmCPackGenerator,projectName,groupName);
  if (group != (cmCPackComponentGroup *)0x0) {
    GetGroupPackageName_abi_cxx11_(&local_1e0,this,group);
    this_00 = &this->Packages;
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
            ::find(&this_00->_M_t,&local_1e0);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->Packages)._M_t._M_impl.super__Rb_tree_header) {
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                ::operator[](this_00,&local_1e0);
      local_1c0 = this_02;
      std::__cxx11::string::_M_assign((string *)&this_02->Name);
      this_02->Generator = this;
      iVar1 = cmCPackIFWPackage::ConfigureFromGroup(this_02,group);
      if (iVar1 == 0) {
        pVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                ::equal_range(&this_00->_M_t,&local_1e0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node
                      );
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,"Cannot configure package \"",0x1a);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_198,local_1e0._M_dataplus._M_p,
                            local_1e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" for component group \"",0x17);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(group->Name)._M_dataplus._M_p,(group->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
        std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        this_01 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        msg = local_1b8;
        length = strlen((char *)local_1b8);
        cmCPackLog::Log(this_01,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                        ,0x1d4,(char *)msg,length);
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
        std::ios_base::~ios_base(local_128);
      }
      else {
        this_02->Installer = &this->Installer;
        local_198._0_8_ = &local_188;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_198,local_1e0._M_dataplus._M_p,
                   local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
        local_178 = this_02;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,cmCPackIFWPackage*>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>>
                    *)&(this->Installer).Packages,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>
                    *)local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._0_8_ != &local_188) {
          operator_delete((void *)local_198._0_8_,local_188._M_allocated_capacity + 1);
        }
        local_198._0_8_ = group;
        local_198._8_8_ = this_02;
        std::
        _Rb_tree<cmCPackComponentGroup*,std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>,std::_Select1st<std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>>,std::less<cmCPackComponentGroup*>,std::allocator<std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>>>
        ::_M_emplace_unique<std::pair<cmCPackComponentGroup*,cmCPackIFWPackage*>>
                  ((_Rb_tree<cmCPackComponentGroup*,std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>,std::_Select1st<std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>>,std::less<cmCPackComponentGroup*>,std::allocator<std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>>>
                    *)&this->GroupPackages,
                   (pair<cmCPackComponentGroup_*,_cmCPackIFWPackage_*> *)local_198);
        std::
        _Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
        ::_M_insert_unique<cmCPackIFWPackage*const&>
                  ((_Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
                    *)&this->BinaryPackages,&local_1c0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  return group;
}

Assistant:

cmCPackComponentGroup*
cmCPackIFWGenerator::GetComponentGroup(const std::string &projectName,
                                       const std::string &groupName)
{
  cmCPackComponentGroup* group
    = cmCPackGenerator::GetComponentGroup(projectName, groupName);
  if(!group) return group;

  std::string name = GetGroupPackageName(group);
  PackagesMap::iterator pit = Packages.find(name);
  if(pit != Packages.end()) return group;

  cmCPackIFWPackage *package = &Packages[name];
  package->Name = name;
  package->Generator = this;
  if(package->ConfigureFromGroup(group))
    {
    package->Installer = &Installer;
    Installer.Packages.insert(
      std::pair<std::string, cmCPackIFWPackage*>(
        name, package));
    GroupPackages.insert(
      std::pair<cmCPackComponentGroup*, cmCPackIFWPackage*>(
        group, package));
    BinaryPackages.insert(package);
    }
  else
    {
    Packages.erase(name);
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot configure package \"" << name <<
                  "\" for component group \"" << group->Name << "\""
                  << std::endl);
    }
  return group;
}